

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

bool __thiscall
CLOParser::getOption<std::__cxx11::string>
          (CLOParser *this,char *names,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pResult,
          bool fValueOptional)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  istream *piVar5;
  ulong uVar6;
  string *psVar7;
  ulong uVar8;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  istringstream iss_1;
  istringstream iss;
  string keyword;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  string local_3c8 [32];
  istringstream local_3a8 [384];
  undefined4 local_228;
  allocator local_221;
  string local_220 [32];
  istringstream local_200 [384];
  string local_80 [55];
  allocator local_49;
  string local_48;
  byte local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  char *local_18;
  byte local_1;
  
  local_21 = in_CL & 1;
  if (*(int *)*in_RDI < *(int *)(in_RDI + 1)) {
    pcVar1 = *(char **)(in_RDI[2] + (long)*(int *)*in_RDI * 8);
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    std::__cxx11::string::string(local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,local_18,&local_221);
    std::__cxx11::istringstream::istringstream(local_200,local_220,_S_in);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    do {
      do {
        do {
          piVar5 = std::operator>>((istream *)local_200,local_80);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
          if (!bVar2) {
            local_1 = 0;
            local_228 = 1;
            goto LAB_0028f668;
          }
          uVar6 = std::__cxx11::string::size();
        } while (((2 < uVar6) ||
                 (local_20 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) &&
                (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_fffffffffffffbd7,
                                                     in_stack_fffffffffffffbd0),
                                         in_stack_fffffffffffffbc8), bVar2));
        psVar7 = (string *)std::__cxx11::string::size();
        iVar4 = std::__cxx11::string::compare((ulong)&local_48,0,psVar7);
      } while (iVar4 != 0);
      uVar6 = std::__cxx11::string::size();
      uVar8 = std::__cxx11::string::size();
      if (uVar8 <= uVar6) {
        if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          local_1 = 1;
          local_228 = 1;
          goto LAB_0028f668;
        }
        *(int *)*in_RDI = *(int *)*in_RDI + 1;
        if (*(int *)(in_RDI + 1) <= *(int *)*in_RDI) {
          local_1 = local_21 & 1;
          local_228 = 1;
          goto LAB_0028f668;
        }
        std::__cxx11::string::operator=
                  ((string *)&local_48,*(char **)(in_RDI[2] + (long)*(int *)*in_RDI * 8));
        goto LAB_0028f4fd;
      }
    } while (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)&local_48,0);
LAB_0028f4fd:
    bVar2 = assignStr<std::__cxx11::string*>(&local_20,&local_48);
    if (bVar2) {
      local_1 = 1;
      local_228 = 1;
    }
    else {
      std::__cxx11::istringstream::istringstream(local_3a8,(string *)&local_48,_S_in);
      std::__cxx11::string::string(local_3c8);
      piVar5 = std::operator>>((istream *)local_3a8,local_3c8);
      bVar3 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if ((bVar3 & 1) == 0) {
        std::__cxx11::string::operator=((string *)local_20,local_3c8);
        local_1 = 1;
      }
      else {
        *(int *)*in_RDI = *(int *)*in_RDI + -1;
        if ((local_21 & 1) == 0) {
          local_1 = 0;
        }
        else {
          local_1 = 1;
        }
      }
      local_228 = 1;
      std::__cxx11::string::~string(local_3c8);
      std::__cxx11::istringstream::~istringstream(local_3a8);
    }
LAB_0028f668:
    std::__cxx11::istringstream::~istringstream(local_200);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

inline bool getOption(const char* names,           // space-separated option list
												Value* pResult = nullptr,    // pointer to value storage
												bool fValueOptional = false  // if pResult, for non-string values
	) {
		assert(nullptr == strchr(names, ','));
		assert(nullptr == strchr(names, ';'));
		if (i >= argc) {
			return false;
		}
		assert(argv[i]);
		std::string arg(argv[i]);
		/// Separate keywords
		std::string keyword;
		std::istringstream iss(names);
		while (iss >> keyword) {
			if (((2 < keyword.size() || nullptr == pResult) && arg != keyword) ||  // exact cmp
					(0 != arg.compare(0, keyword.size(), keyword))) {                  // truncated cmp
				continue;
			}
			/// Process it
			if (keyword.size() < arg.size()) {
				if (nullptr == pResult) {
					continue;
				}
				arg.erase(0, keyword.size());
			} else {
				if (nullptr == pResult) {
					return true;
				}
				i++;
				if (i >= argc) {
					return fValueOptional;
				}
				arg = argv[i];
			}
			assert(pResult);
			if (assignStr(pResult, arg)) {
				return true;
			}
			std::istringstream iss(arg);  // NOLINT
			Value tmp;
			if (!(iss >> tmp)) {
				--i;
				if (fValueOptional) {
					return true;
				}
				// Not print because another agent can handle this option
				//           cerr << "\nBad value for " << keyword << ": " << arg << endl;
				return false;
			}
			*pResult = tmp;
			return true;
		}
		return false;
	}